

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroLiFloat
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  undefined4 in_register_0000000c;
  uint in_R8D;
  long lVar1;
  initializer_list<AssemblyTemplateArgument> variables;
  string macroText;
  char *local_78;
  string local_70;
  char *local_50;
  string local_48 [32];
  
  preprocessMacro_abi_cxx11_
            (&macroText,"\n\t\tli \t\tr1,float(%imm%)\n\t\tmtc1\tr1,%rs%\n\t",
             (MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_78 = "%imm%";
  Expression::toString_abi_cxx11_
            (&local_70,
             &(((MipsImmediateData *)CONCAT44(in_register_0000000c,flags))->secondary).expression);
  local_50 = "%rs%";
  std::__cxx11::string::string(local_48,(string *)&immediates[1].secondary.value);
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&local_78;
  createMacro(parser,(string *)registers,(int)&macroText,variables);
  lVar1 = 0x30;
  do {
    std::__cxx11::string::~string((string *)((long)&local_78 + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&macroText);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroLiFloat(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* templateLiFloat = R"(
		li 		r1,float(%imm%)
		mtc1	r1,%rs%
	)";

	std::string macroText = preprocessMacro(templateLiFloat,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%imm%",		immediates.secondary.expression.toString() },
			{ "%rs%",		registers.frs.name.string() },
	});
}